

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_artifact_set_values(parser *p)

{
  long lVar1;
  bool bVar2;
  errr eVar3;
  errr eVar4;
  parser_error pVar5;
  void *pvVar6;
  char *pcVar7;
  wchar_t index;
  wchar_t value;
  int local_48;
  int local_44;
  char *local_40;
  long local_38;
  
  pvVar6 = parser_priv(p);
  if (pvVar6 == (void *)0x0) {
    __assert_fail("set",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                  ,0xd59,"enum parser_error parse_artifact_set_values(struct parser *)");
  }
  lVar1 = *(long *)((long)pvVar6 + 0x20);
  if (lVar1 == 0) {
    __assert_fail("e",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                  ,0xd5a,"enum parser_error parse_artifact_set_values(struct parser *)");
  }
  pcVar7 = parser_getstr(p,"values");
  local_40 = string_make(pcVar7);
  pcVar7 = strtok(local_40," |");
  local_38 = lVar1;
  do {
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)0x0;
      break;
    }
    local_44 = 0;
    local_48 = 0;
    eVar3 = grab_int_value((int16_t *)(lVar1 + 0x12),obj_mods,pcVar7);
    eVar4 = grab_index_and_int(&local_44,&local_48,element_names,"RES_",pcVar7);
    if (eVar4 == 0) {
      *(short *)(local_38 + 0x34 + (long)local_48 * 4) = 100 - (short)local_44;
LAB_001a2ddd:
      pcVar7 = strtok((char *)0x0," |");
      bVar2 = true;
    }
    else {
      if (eVar3 == 0) goto LAB_001a2ddd;
      bVar2 = false;
    }
  } while (bVar2);
  mem_free(local_40);
  pVar5 = PARSE_ERROR_INVALID_VALUE;
  if (pcVar7 == (char *)0x0) {
    pVar5 = PARSE_ERROR_NONE;
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_artifact_set_values(struct parser *p) {
	struct artifact_set *set = parser_priv(p);
	struct set_item *e = set->set_item;
	char *s;
	char *t;
	assert(set);
	assert(e);

	s = string_make(parser_getstr(p, "values"));
	t = strtok(s, " |");

	while (t) {
		bool found = false;
		int value = 0;
		int index = 0;
		if (!grab_int_value(e->modifiers, obj_mods, t))
			found = true;
		if (!grab_index_and_int(&value, &index, element_names, "RES_", t)) {
			found = true;
			e->el_info[index].res_level = RES_LEVEL_BASE - value;
		}
		if (!found)
			break;

		t = strtok(NULL, " |");
	}

	mem_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}